

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

bool __thiscall
HighsSymmetryDetection::isFromBinaryColumn(HighsSymmetryDetection *this,HighsInt pos)

{
  double dVar1;
  int iVar2;
  HighsLp *pHVar3;
  
  if (pos < this->numActiveCols) {
    pHVar3 = this->model;
    iVar2 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[pos];
    dVar1 = (pHVar3->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    if ((((dVar1 == 0.0) && (!NAN(dVar1))) &&
        (dVar1 = (pHVar3->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2], dVar1 == 1.0)) && (!NAN(dVar1))) {
      return (pHVar3->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2] != kContinuous;
    }
  }
  return false;
}

Assistant:

bool HighsSymmetryDetection::isFromBinaryColumn(HighsInt pos) const {
  if (pos >= numActiveCols) return false;

  HighsInt col = currentPartition[pos];

  if (model->col_lower_[col] != 0.0 || model->col_upper_[col] != 1.0 ||
      model->integrality_[col] == HighsVarType::kContinuous)
    return false;

  return true;
}